

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__filename;
  InterpretResult IVar1;
  FILE *__stream;
  ulong __n;
  char *source;
  size_t sVar2;
  Vm local_2130;
  
  if (argc != 2) {
    if (argc == 1) {
      run_repl();
    }
    else {
      main_cold_4();
    }
    return 0;
  }
  __filename = argv[1];
  vm_init(&local_2130,false);
  __stream = fopen(__filename,"rb");
  if (__stream == (FILE *)0x0) {
    main_cold_3();
LAB_001019f6:
    main_cold_2();
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    source = (char *)malloc(__n + 1);
    if (source == (char *)0x0) goto LAB_001019f6;
    sVar2 = fread(source,1,__n,__stream);
    if (__n <= sVar2) {
      source[sVar2] = '\0';
      fclose(__stream);
      IVar1 = interpret(&local_2130,source);
      vm_free(&local_2130);
      free(source);
      if (IVar1 != INTERPRET_COMPILE_ERROR) {
        if (IVar1 != INTERPRET_RUNTIME_ERROR) {
          return 0;
        }
        printf("Error while interpreting %s\n",__filename);
        exit(0x2a);
      }
      goto LAB_00101a06;
    }
  }
  main_cold_1();
LAB_00101a06:
  printf("Error while compiling %s\n",__filename);
  exit(0x2b);
}

Assistant:

int main(int argc, char **argv) {
    if (argc == 1) {
        run_repl();
    } else if (argc == 2) {
        run_file(argv[1]);
    } else {
        fprintf(stderr, "Usage: calc");
    }

    return 0;
}